

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O0

unique_ptr<verilogAST::CallExpr,_std::default_delete<verilogAST::CallExpr>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::CallExpr,_std::default_delete<verilogAST::CallExpr>_> *node)

{
  bool bVar1;
  pointer pCVar2;
  unique_ptr<verilogAST::CallExpr,_std::default_delete<verilogAST::CallExpr>_> *in_RDX;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_68;
  value_type local_60;
  reference local_58;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> *expr;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  *__range1;
  vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  new_args;
  unique_ptr<verilogAST::CallExpr,_std::default_delete<verilogAST::CallExpr>_> *node_local;
  Transformer *this_local;
  
  std::
  vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  ::vector((vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
            *)&__range1);
  pCVar2 = std::unique_ptr<verilogAST::CallExpr,_std::default_delete<verilogAST::CallExpr>_>::
           operator->(in_RDX);
  __end1 = std::
           vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
           ::begin((vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
                    *)(pCVar2 + 0x28));
  expr = (unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> *)
         std::
         vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
         ::end((vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
                *)(pCVar2 + 0x28));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_*,_std::vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
                                *)&expr);
    if (!bVar1) break;
    local_58 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_*,_std::vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
               ::operator*(&__end1);
    std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
    unique_ptr(&local_68,local_58);
    (**(code **)(node->_M_t).
                super___uniq_ptr_impl<verilogAST::CallExpr,_std::default_delete<verilogAST::CallExpr>_>
                ._M_t.
                super__Tuple_impl<0UL,_verilogAST::CallExpr_*,_std::default_delete<verilogAST::CallExpr>_>
                .super__Head_base<0UL,_verilogAST::CallExpr_*,_false>._M_head_impl)
              (&local_60,node,&local_68);
    std::
    vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
    ::push_back((vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
                 *)&__range1,&local_60);
    std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
    ~unique_ptr(&local_60);
    std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
    ~unique_ptr(&local_68);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_*,_std::vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
    ::operator++(&__end1);
  }
  pCVar2 = std::unique_ptr<verilogAST::CallExpr,_std::default_delete<verilogAST::CallExpr>_>::
           operator->(in_RDX);
  std::
  vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  ::operator=((vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
               *)(pCVar2 + 0x28),
              (vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
               *)&__range1);
  std::unique_ptr<verilogAST::CallExpr,_std::default_delete<verilogAST::CallExpr>_>::unique_ptr
            ((unique_ptr<verilogAST::CallExpr,_std::default_delete<verilogAST::CallExpr>_> *)this,
             in_RDX);
  std::
  vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
  ::~vector((vector<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::allocator<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>
             *)&__range1);
  return (__uniq_ptr_data<verilogAST::CallExpr,_std::default_delete<verilogAST::CallExpr>,_true,_true>
          )(__uniq_ptr_data<verilogAST::CallExpr,_std::default_delete<verilogAST::CallExpr>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<CallExpr> Transformer::visit(std::unique_ptr<CallExpr> node) {
  std::vector<std::unique_ptr<Expression>> new_args;
  for (auto&& expr : node->args) {
    new_args.push_back(this->visit(std::move(expr)));
  }
  node->args = std::move(new_args);
  return node;
}